

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void test_oo(void)

{
  clock_t cVar1;
  clock_t cVar2;
  undefined1 local_c40 [8];
  dsfmt_t dsfmt;
  double *array;
  uint64_t sum;
  uint64_t clo;
  uint local_18;
  uint32_t j;
  uint32_t i;
  
  dsfmt._3072_8_ = dummy;
  dsfmt_chk_init_gen_rand((dsfmt_t *)local_c40,0x4d2,0x4de1);
  array = (double *)0x0;
  for (local_18 = 0; local_18 < 10; local_18 = local_18 + 1) {
    cVar1 = clock();
    for (clo._4_4_ = 0; clo._4_4_ < 2000; clo._4_4_ = clo._4_4_ + 1) {
      dsfmt_fill_array_open_open((dsfmt_t *)local_c40,(double *)dsfmt._3072_8_,50000);
    }
    cVar2 = clock();
    array = (double *)((cVar2 - cVar1) + (long)array);
  }
  printf("ST BLOCK (0, 1) AVE:%4lums.\n",(ulong)((long)array * 100) / 1000000,
         (ulong)((long)array * 100) % 1000000);
  return;
}

Assistant:

static void test_oo(void) {
    uint32_t i, j;
    uint64_t clo;
    uint64_t sum;
    double *array = (double *)dummy;
    dsfmt_t dsfmt;
#if 0
    dsfmt_gv_init_gen_rand(1234);
    sum = 0;
    for (i = 0; i < 10; i++) {
	clo = clock();
	for (j = 0; j < TIC_COUNT; j++) {
	    dsfmt_gv_fill_array_open_open(array, NUM_RANDS);
	}
	clo = clock() - clo;
	sum += clo;
    }
    printf("GL BLOCK (0, 1) AVE:%4" PRIu64"ms.\n",
	   (sum * 100) / CLOCKS_PER_SEC);
#endif
    dsfmt_init_gen_rand(&dsfmt, 1234);
    sum = 0;
    for (i = 0; i < 10; i++) {
        clo = clock();
        for (j = 0; j < TIC_COUNT; j++) {
            dsfmt_fill_array_open_open(&dsfmt, array, NUM_RANDS);
        }
        clo = clock() - clo;
        sum += clo;
    }
    printf("ST BLOCK (0, 1) AVE:%4" PRIu64"ms.\n",
           (sum * 100) / CLOCKS_PER_SEC);
}